

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdFindSupportOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v,int u)

{
  int iVar1;
  int iVar2;
  uint local_38;
  uint local_34;
  int Status;
  int nWords;
  int u_local;
  int v_local;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  if (p == (Dau_Dsd_t *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = Dau_DsdLookupVarCache(p,pVars[v],pVars[u]);
  }
  local_34 = local_38;
  if (local_38 == 0) {
    if (v < u) {
      iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar1,v,u,1,3);
      iVar1 = Abc_TtCheckEqualCofs(pTruth,iVar1,v,u,0,2);
      local_34 = (uint)((iVar2 != 0 ^ 0xffU) & 1) << 1 | (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
    else {
      iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar1,u,v,2,3);
      iVar1 = Abc_TtCheckEqualCofs(pTruth,iVar1,u,v,0,1);
      local_34 = (uint)((iVar2 != 0 ^ 0xffU) & 1) << 1 | (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
    if (local_34 == 0) {
      __assert_fail("Status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x62f,"int Dau_DsdFindSupportOne(Dau_Dsd_t *, word *, int *, int, int, int)");
    }
    if (p != (Dau_Dsd_t *)0x0) {
      Dau_DsdInsertVarCache(p,pVars[v],pVars[u],local_34);
    }
  }
  return local_34;
}

Assistant:

static inline int Dau_DsdFindSupportOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v, int u )
{
    int nWords = Abc_TtWordNum(nVars);
    int Status = p ? Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) : 0;
    if ( Status == 0 )
    {
//        Status = (Abc_Tt6HasVar(tCof1, u) << 1) | Abc_Tt6HasVar(tCof0, u);
        if ( v < u )
            Status = (!Abc_TtCheckEqualCofs(pTruth, nWords, v, u, 1, 3) << 1) | !Abc_TtCheckEqualCofs(pTruth, nWords, v, u, 0, 2);
        else // if ( v > u )
            Status = (!Abc_TtCheckEqualCofs(pTruth, nWords, u, v, 2, 3) << 1) | !Abc_TtCheckEqualCofs(pTruth, nWords, u, v, 0, 1);
        assert( Status != 0 );
        if ( p )
            Dau_DsdInsertVarCache( p, pVars[v], pVars[u], Status );
    }
    return Status;
}